

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O1

Bucket __thiscall
QHashPrivate::Data<QHashPrivate::Node<QString,_bool>_>::findBucketWithHash<QString>
          (Data<QHashPrivate::Node<QString,_bool>_> *this,QString *key,size_t hash)

{
  byte bVar1;
  ulong uVar2;
  Span *pSVar3;
  char16_t *pcVar4;
  long lVar5;
  long lVar6;
  bool bVar7;
  char cVar8;
  Span *pSVar9;
  Span *pSVar10;
  ulong uVar11;
  Bucket BVar12;
  QStringView QVar13;
  QStringView QVar14;
  
  uVar2 = this->numBuckets;
  pSVar3 = this->spans;
  uVar11 = uVar2 - 1 & hash;
  pSVar9 = pSVar3 + (uVar11 >> 7);
  uVar11 = (ulong)((uint)uVar11 & 0x7f);
  pcVar4 = (key->d).ptr;
  lVar5 = (key->d).size;
  do {
    bVar1 = pSVar9->offsets[uVar11];
    if (bVar1 == 0xff) {
LAB_0014b5b5:
      bVar7 = false;
    }
    else {
      lVar6 = *(long *)(pSVar9->entries[bVar1].storage.data + 0x10);
      if (lVar6 == lVar5) {
        QVar13.m_data = *(storage_type_conflict **)(pSVar9->entries[bVar1].storage.data + 8);
        QVar13.m_size = lVar6;
        QVar14.m_data = pcVar4;
        QVar14.m_size = lVar5;
        cVar8 = QtPrivate::equalStrings(QVar13,QVar14);
        if (cVar8 != '\0') goto LAB_0014b5b5;
      }
      uVar11 = uVar11 + 1;
      bVar7 = true;
      if (uVar11 == 0x80) {
        pSVar10 = pSVar9 + 1;
        pSVar9 = pSVar3;
        if (((long)pSVar10 - (long)pSVar3 >> 4) * -0x71c71c71c71c71c7 - (uVar2 >> 7) != 0) {
          pSVar9 = pSVar10;
        }
        uVar11 = 0;
      }
    }
    if (!bVar7) {
      BVar12.index = uVar11;
      BVar12.span = pSVar9;
      return BVar12;
    }
  } while( true );
}

Assistant:

Bucket findBucketWithHash(const K &key, size_t hash) const noexcept
    {
        static_assert(std::is_same_v<std::remove_cv_t<Key>, K> ||
                QHashHeterogeneousSearch<std::remove_cv_t<Key>, K>::value);
        Q_ASSERT(numBuckets > 0);
        Bucket bucket(this, GrowthPolicy::bucketForHash(numBuckets, hash));
        // loop over the buckets until we find the entry we search for
        // or an empty slot, in which case we know the entry doesn't exist
        while (true) {
            size_t offset = bucket.offset();
            if (offset == SpanConstants::UnusedEntry) {
                return bucket;
            } else {
                Node &n = bucket.nodeAtOffset(offset);
                if (qHashEquals(n.key, key))
                    return bucket;
            }
            bucket.advanceWrapped(this);
        }
    }